

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Clara::Parser::writeToStream(Parser *this,ostream *os)

{
  StringRef str;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  string *psVar5;
  undefined4 extraout_var;
  long lVar6;
  unsigned_long *puVar7;
  Column *lhs;
  ostream *in_RSI;
  StringRef *in_RDI;
  Columns row;
  HelpColumns *cols_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  *__range2_1;
  HelpColumns *cols;
  iterator __end2;
  iterator __begin2;
  vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  *__range2;
  size_t optWidth;
  size_t consoleWidth;
  vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_> rows
  ;
  Arg *arg;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_> *__range3;
  bool first;
  bool required;
  string *in_stack_fffffffffffffdd8;
  Column *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  Column *in_stack_fffffffffffffdf0;
  Column *in_stack_fffffffffffffe00;
  Column *in_stack_fffffffffffffe08;
  string local_1e0 [8];
  size_t in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe58;
  Columns *in_stack_fffffffffffffe68;
  ostream *in_stack_fffffffffffffe70;
  Column local_140;
  reference local_d0;
  HelpColumns *local_c8;
  __normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
  local_c0;
  undefined1 *local_b8;
  ulong local_b0 [3];
  unsigned_long local_98;
  reference local_90;
  HelpColumns *local_88;
  __normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
  local_80;
  undefined1 *local_78;
  unsigned_long local_70;
  ulong local_68;
  undefined1 local_60 [24];
  StringRef local_48;
  ParserRefImpl<Catch::Clara::Arg> *local_38;
  Arg *local_30;
  __normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
  local_28;
  size_type *local_20;
  byte local_12;
  byte local_11;
  ostream *local_10;
  
  local_10 = in_RSI;
  ExeName::name_abi_cxx11_((ExeName *)0x1875bd);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar4 = std::operator<<(local_10,"usage:\n");
    poVar4 = std::operator<<(poVar4,"  ");
    psVar5 = ExeName::name_abi_cxx11_((ExeName *)0x187603);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    std::operator<<(poVar4,' ');
    local_11 = 1;
    local_12 = 1;
    local_20 = &in_RDI[4].m_size;
    local_28._M_current =
         (Arg *)std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::begin
                          ((vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_> *)
                           in_stack_fffffffffffffdd8);
    local_30 = (Arg *)std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::end
                                ((vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_> *)
                                 in_stack_fffffffffffffdd8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
                               *)in_stack_fffffffffffffde0,
                              (__normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
                               *)in_stack_fffffffffffffdd8), bVar1) {
      local_38 = &__gnu_cxx::
                  __normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
                  ::operator*(&local_28)->super_ParserRefImpl<Catch::Clara::Arg>;
      if ((local_12 & 1) == 0) {
        std::operator<<(local_10,' ');
      }
      else {
        local_12 = 0;
      }
      bVar1 = Detail::ParserRefImpl<Catch::Clara::Arg>::isOptional(local_38);
      if ((bVar1) && ((local_11 & 1) != 0)) {
        std::operator<<(local_10,'[');
        local_11 = 0;
      }
      in_stack_fffffffffffffe08 = (Column *)std::operator<<(local_10,'<');
      local_48 = Detail::ParserRefImpl<Catch::Clara::Arg>::hint(local_38);
      str.m_size = (size_type)in_stack_fffffffffffffdf0;
      str.m_start = in_stack_fffffffffffffde8;
      poVar4 = Catch::operator<<((ostream *)in_stack_fffffffffffffde0,str);
      std::operator<<(poVar4,'>');
      iVar2 = (*(local_38->super_ComposableParserImpl<Catch::Clara::Arg>).super_ParserBase.
                _vptr_ParserBase[4])();
      if (CONCAT44(extraout_var,iVar2) == 0) {
        std::operator<<(local_10," ... ");
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
      ::operator++(&local_28);
    }
    if ((local_11 & 1) == 0) {
      std::operator<<(local_10,']');
    }
    bVar1 = std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::empty
                      ((vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_> *)
                       in_stack_fffffffffffffdf0);
    if (!bVar1) {
      std::operator<<(local_10," options");
    }
    std::operator<<(local_10,"\n\nwhere options are:\n");
  }
  getHelpColumns((Parser *)in_stack_fffffffffffffe58);
  local_68 = 0x50;
  local_70 = 0;
  local_78 = local_60;
  local_80._M_current =
       (HelpColumns *)
       std::
       vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
       ::begin((vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                *)in_stack_fffffffffffffdd8);
  local_88 = (HelpColumns *)
             std::
             vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
             ::end((vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                    *)in_stack_fffffffffffffdd8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
                             *)in_stack_fffffffffffffde0,
                            (__normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
                             *)in_stack_fffffffffffffdd8), bVar1) {
    local_90 = __gnu_cxx::
               __normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
               ::operator*(&local_80);
    lVar6 = std::__cxx11::string::size();
    local_98 = lVar6 + 2;
    in_stack_fffffffffffffe00 = (Column *)std::max<unsigned_long>(&local_70,&local_98);
    local_70 = *(unsigned_long *)&(in_stack_fffffffffffffe00->m_string).m_string;
    __gnu_cxx::
    __normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
    ::operator++(&local_80);
  }
  local_b0[0] = local_68 >> 1;
  puVar7 = std::min<unsigned_long>(&local_70,local_b0);
  local_70 = *puVar7;
  local_b8 = local_60;
  local_c0._M_current =
       (HelpColumns *)
       std::
       vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
       ::begin((vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                *)in_stack_fffffffffffffdd8);
  local_c8 = (HelpColumns *)
             std::
             vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
             ::end((vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                    *)in_stack_fffffffffffffdd8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
                             *)in_stack_fffffffffffffde0,
                            (__normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
                             *)in_stack_fffffffffffffdd8), bVar1) {
    local_d0 = __gnu_cxx::
               __normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
               ::operator*(&local_c0);
    TextFlow::Column::Column(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffdf0 = TextFlow::Column::width(&local_140,local_70);
    lhs = TextFlow::Column::indent(in_stack_fffffffffffffdf0,2);
    TextFlow::Spacer(in_stack_fffffffffffffe28);
    TextFlow::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    StringRef::operator_cast_to_string(in_RDI);
    TextFlow::Column::Column(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffde0 =
         TextFlow::Column::width((Column *)&stack0xfffffffffffffe40,(local_68 - local_70) - 7);
    TextFlow::operator+((Columns *)lhs,in_stack_fffffffffffffde0);
    TextFlow::Column::~Column((Column *)0x187a88);
    std::__cxx11::string::~string(local_1e0);
    TextFlow::Columns::~Columns((Columns *)0x187a9f);
    TextFlow::Column::~Column((Column *)0x187aac);
    TextFlow::Column::~Column((Column *)0x187ab9);
    in_stack_fffffffffffffdd8 =
         (string *)TextFlow::operator<<(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::operator<<((ostream *)in_stack_fffffffffffffdd8,'\n');
    TextFlow::Columns::~Columns((Columns *)0x187af1);
    __gnu_cxx::
    __normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
    ::operator++(&local_c0);
  }
  std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  ::~vector((vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
             *)in_stack_fffffffffffffdf0);
  return;
}

Assistant:

void Parser::writeToStream( std::ostream& os ) const {
            if ( !m_exeName.name().empty() ) {
                os << "usage:\n"
                   << "  " << m_exeName.name() << ' ';
                bool required = true, first = true;
                for ( auto const& arg : m_args ) {
                    if ( first )
                        first = false;
                    else
                        os << ' ';
                    if ( arg.isOptional() && required ) {
                        os << '[';
                        required = false;
                    }
                    os << '<' << arg.hint() << '>';
                    if ( arg.cardinality() == 0 )
                        os << " ... ";
                }
                if ( !required )
                    os << ']';
                if ( !m_options.empty() )
                    os << " options";
                os << "\n\nwhere options are:\n";
            }

            auto rows = getHelpColumns();
            size_t consoleWidth = CATCH_CONFIG_CONSOLE_WIDTH;
            size_t optWidth = 0;
            for ( auto const& cols : rows )
                optWidth = ( std::max )( optWidth, cols.left.size() + 2 );

            optWidth = ( std::min )( optWidth, consoleWidth / 2 );

            for ( auto& cols : rows ) {
                auto row = TextFlow::Column( CATCH_MOVE(cols.left) )
                               .width( optWidth )
                               .indent( 2 ) +
                           TextFlow::Spacer( 4 ) +
                           TextFlow::Column( static_cast<std::string>(cols.descriptions) )
                               .width( consoleWidth - 7 - optWidth );
                os << row << '\n';
            }
        }